

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O0

void __thiscall asmjit::v1_14::JitAllocator::reset(JitAllocator *this,ResetPolicy resetPolicy)

{
  uint *puVar1;
  ulong uVar2;
  JitAllocatorPool *this_00;
  int in_ESI;
  long *in_RDI;
  JitAllocatorBlock *next;
  JitAllocatorBlock *blockToKeep;
  JitAllocatorBlock *block;
  JitAllocatorPool *pool;
  size_t poolId;
  size_t poolCount;
  JitAllocatorPrivateImpl *impl;
  JitAllocatorBlock *block_00;
  JitAllocatorBlock *block_01;
  JitAllocatorBlock *pJVar3;
  ulong local_50;
  undefined4 in_stack_ffffffffffffffe8;
  uint in_stack_ffffffffffffffec;
  JitAllocatorPrivateImpl *in_stack_fffffffffffffff0;
  
  if ((undefined1 *)*in_RDI != JitAllocatorImpl_none) {
    puVar1 = (uint *)*in_RDI;
    puVar1[0x12] = 0;
    puVar1[0x13] = 0;
    uVar2 = *(ulong *)(puVar1 + 0x16);
    for (local_50 = 0; local_50 < uVar2; local_50 = local_50 + 1) {
      this_00 = (JitAllocatorPool *)(*(long *)(puVar1 + 0x14) + local_50 * 0x48);
      pJVar3 = *(JitAllocatorBlock **)this_00;
      JitAllocatorPool::reset(this_00);
      if (pJVar3 != (JitAllocatorBlock *)0x0) {
        block_01 = (JitAllocatorBlock *)0x0;
        block_00 = pJVar3;
        if (in_ESI != 1) {
          in_stack_ffffffffffffffec = *puVar1;
          in_stack_ffffffffffffffe8 = 8;
          if ((in_stack_ffffffffffffffec & 8) == 0) {
            block_00 = *(JitAllocatorBlock **)&pJVar3->field_0x18;
            block_01 = pJVar3;
          }
        }
        while (block_00 != (JitAllocatorBlock *)0x0) {
          in_stack_fffffffffffffff0 =
               (JitAllocatorPrivateImpl *)
               &block_00->super_ZoneListNode<asmjit::v1_14::JitAllocatorBlock>;
          block_00 = *(JitAllocatorBlock **)&block_00->field_0x18;
          JitAllocatorImpl_deleteBlock((JitAllocatorPrivateImpl *)block_01,block_00);
        }
        if (block_01 != (JitAllocatorBlock *)0x0) {
          *(undefined8 *)&block_01->super_ZoneListNode<asmjit::v1_14::JitAllocatorBlock> = 0;
          *(undefined8 *)&block_01->field_0x18 = 0;
          JitAllocatorImpl_wipeOutBlock
                    (in_stack_fffffffffffffff0,
                     (JitAllocatorBlock *)
                     CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
          JitAllocatorImpl_insertBlock((JitAllocatorPrivateImpl *)block_00,block_01);
          this_00->emptyBlockCount = '\x01';
        }
      }
    }
  }
  return;
}

Assistant:

void JitAllocator::reset(ResetPolicy resetPolicy) noexcept {
  if (_impl == &JitAllocatorImpl_none)
    return;

  JitAllocatorPrivateImpl* impl = static_cast<JitAllocatorPrivateImpl*>(_impl);
  impl->tree.reset();
  size_t poolCount = impl->poolCount;

  for (size_t poolId = 0; poolId < poolCount; poolId++) {
    JitAllocatorPool& pool = impl->pools[poolId];
    JitAllocatorBlock* block = pool.blocks.first();

    pool.reset();

    if (block) {
      JitAllocatorBlock* blockToKeep = nullptr;
      if (resetPolicy != ResetPolicy::kHard && uint32_t(impl->options & JitAllocatorOptions::kImmediateRelease) == 0) {
        blockToKeep = block;
        block = block->next();
      }

      while (block) {
        JitAllocatorBlock* next = block->next();
        JitAllocatorImpl_deleteBlock(impl, block);
        block = next;
      }

      if (blockToKeep) {
        blockToKeep->_listNodes[0] = nullptr;
        blockToKeep->_listNodes[1] = nullptr;
        JitAllocatorImpl_wipeOutBlock(impl, blockToKeep);
        JitAllocatorImpl_insertBlock(impl, blockToKeep);
        pool.emptyBlockCount = 1;
      }
    }
  }
}